

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspec.c
# Opt level: O1

void apet_walk_to_room(CHAR_DATA *ch,int vnum)

{
  ROOM_INDEX_DATA *pRVar1;
  CHAR_DATA *pCVar2;
  ROOM_INDEX_DATA *pRVar3;
  int in_ESI;
  CHAR_DATA *in_RDI;
  char *__end;
  CHAR_DATA *local_70;
  int local_64;
  string local_60;
  string local_40;
  
  local_70 = in_RDI;
  local_64 = in_ESI;
  pRVar3 = get_room_index(0);
  pRVar1 = local_70->in_room;
  if (pRVar1 != pRVar3) {
    walk_to_room(local_70,pRVar3);
    pRVar3 = local_70->in_room;
    if ((pRVar3 == pRVar1) || (pRVar3 != local_70->leader->in_room)) {
      if (pRVar3 != local_70->leader->in_room) {
        char_from_room(local_70);
        char_to_room(local_70,local_70->leader->in_room);
      }
      do_say(local_70,
             "I can\'t seem to lead us over there from here.  Try heading back to another part of town?"
            );
      pCVar2 = local_70->leader;
      pCVar2->master = local_70;
      local_70->master = pCVar2;
    }
    else {
      WAIT_STATE(local_70->leader,0xc);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"apet_walk_to_room","");
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"apet_walk_to_room","");
      CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int&>
                (&RS.Queue,2,&local_40,&local_60,apet_walk_to_room,&local_70,&local_64);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  apet_at_room(local_70,local_64);
  return;
}

Assistant:

void apet_walk_to_room(CHAR_DATA *ch, int vnum)
{
	ROOM_INDEX_DATA *room = get_room_index(vnum), *oldroom = ch->in_room;

	if (ch->in_room == room)
	{
		apet_at_room(ch, vnum);
		return;
	}

	walk_to_room(ch, room);

	if (ch->in_room == oldroom || ch->in_room != ch->leader->in_room)
	{
		if (ch->in_room != ch->leader->in_room)
		{
			char_from_room(ch);
			char_to_room(ch, ch->leader->in_room);
		}

		do_say(ch, "I can't seem to lead us over there from here.  Try heading back to another part of town?");

		ch->leader->master = ch;
		ch->master = ch->leader;
		return;
	}

	WAIT_STATE(ch->leader, PULSE_VIOLENCE);

	RS.Queue.AddToQueue(2, "apet_walk_to_room", "apet_walk_to_room", apet_walk_to_room, ch, vnum);
}